

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O2

bool __thiscall
lzham::vector<lzham::lzcompressor::lzdecision>::try_push_back
          (vector<lzham::lzcompressor::lzdecision> *this,lzdecision *obj)

{
  lzdecision *plVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  
  uVar4 = this->m_size;
  if (this->m_capacity <= uVar4) {
    bVar3 = increase_capacity(this,uVar4 + 1,true,true);
    if (!bVar3) {
      return false;
    }
    uVar4 = this->m_size;
  }
  plVar1 = this->m_p;
  plVar1[uVar4].m_dist = obj->m_dist;
  iVar2 = obj->m_len;
  plVar1 = plVar1 + uVar4;
  plVar1->m_pos = obj->m_pos;
  plVar1->m_len = iVar2;
  this->m_size = this->m_size + 1;
  return true;
}

Assistant:

inline bool try_push_back(const T& obj)
      {
         LZHAM_ASSERT(!m_p || (&obj < m_p) || (&obj >= (m_p + m_size)));

         if (m_size >= m_capacity)
         {
            if (!increase_capacity(m_size + 1, true, true))
            {
               LZHAM_LOG_ERROR(5007);
               return false;
            }
         }

         scalar_type<T>::construct(m_p + m_size, obj);
         m_size++;

         return true;
      }